

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_syntax.cpp
# Opt level: O2

ParserState * giveup_to_expected(ParserState *__return_storage_ptr__,ParserState *state,char *what)

{
  ParserError *pPVar1;
  token_iterator pTVar2;
  bool bVar3;
  SmallVector<ParserError,_1U> *pSVar4;
  char **in_RCX;
  ParserState *new_state;
  string *this;
  ParserError *pPVar5;
  string local_c8;
  char *local_a8;
  undefined1 local_a0 [16];
  _Alloc_hider local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  undefined1 local_70 [48];
  undefined8 local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_a8 = what;
  bVar3 = is<ParserSuccess,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>>
                    (state);
  if (bVar3) {
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    ::_storage((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                *)__return_storage_ptr__,
               (_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                *)state);
  }
  else {
    *(undefined8 *)
     &(__return_storage_ptr__->_storage).
      super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
      .
      super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
      .
      super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
      .field_0 = 0;
    local_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->_storage).
             super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
             .
             super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
             .
             super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
             .field_0 + 8) = 0;
    local_40 = 0;
    (__return_storage_ptr__->_storage).
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    .
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
    ._which = 1;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
    pSVar4 = eggs::variants::
             get<llvm_vecsmall::SmallVector<ParserError,1u>,ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>,1ul>
                       (state);
    pPVar1 = (ParserError *)
             (pSVar4->super_SmallVectorImpl<ParserError>).
             super_SmallVectorTemplateBase<ParserError,_false>.
             super_SmallVectorTemplateCommon<ParserError,_void>.super_SmallVectorBase.EndX;
    for (pPVar5 = (ParserError *)
                  (pSVar4->super_SmallVectorImpl<ParserError>).
                  super_SmallVectorTemplateBase<ParserError,_false>.
                  super_SmallVectorTemplateCommon<ParserError,_void>.super_SmallVectorBase.BeginX;
        pPVar5 != pPVar1; pPVar5 = pPVar5 + 1) {
      if (pPVar5->state == GiveUp) {
        pTVar2 = pPVar5->context;
        fmt::format<char_const*>(&local_c8,(fmt *)"expected {}",(CStringRef)&local_a8,in_RCX);
        local_a0._0_4_ = Error;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p == &local_c8.field_2) {
          local_80._8_8_ = local_c8.field_2._8_8_;
          local_90._M_p = (pointer)&local_80;
        }
        else {
          local_90._M_p = local_c8._M_dataplus._M_p;
        }
        local_80._M_allocated_capacity._1_7_ = local_c8.field_2._M_allocated_capacity._1_7_;
        local_80._M_local_buf[0] = local_c8.field_2._M_local_buf[0];
        local_88 = local_c8._M_string_length;
        local_c8._M_string_length = 0;
        local_c8.field_2._M_local_buf[0] = '\0';
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        local_a0._8_8_ = pTVar2;
        add_error(__return_storage_ptr__,(ParserError *)local_a0);
        std::__cxx11::string::~string((string *)&local_90);
        this = &local_c8;
      }
      else {
        ParserError::ParserError((ParserError *)local_70,pPVar5);
        add_error(__return_storage_ptr__,(ParserError *)local_70);
        this = (string *)(local_70 + 0x10);
      }
      std::__cxx11::string::~string((string *)this);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static ParserState giveup_to_expected(ParserState state, const char* what)
{
    if(!is<ParserSuccess>(state))
    {
        ParserState new_state = ParserSuccess(nullptr);
        for(auto& e : get<ParserFailure>(state))
        {
            if(e.state == ParserStatus::GiveUp)
                add_error(new_state, ParserError(ParserStatus::Error, e.context, fmt::format("expected {}", what)));
            else
                add_error(new_state, std::move(e));
        }
        return new_state;
    }
    return state;
}